

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stream.hh
# Opt level: O1

void __thiscall avro::StreamWriter::writeBytes(StreamWriter *this,uint8_t *b,size_t n)

{
  ulong __n;
  
  if (n != 0) {
    do {
      if (this->next_ == this->end_) {
        more(this);
      }
      __n = (long)this->end_ - (long)this->next_;
      if (n <= __n) {
        __n = n;
      }
      memcpy(this->next_,b,__n);
      this->next_ = this->next_ + __n;
      b = b + __n;
      n = n - __n;
    } while (n != 0);
  }
  return;
}

Assistant:

void writeBytes(const uint8_t* b, size_t n) {
        while (n > 0) {
            if (next_ == end_) {
                more();
            }
            size_t q = end_ - next_;
            if (q > n) {
                q = n;
            }
            ::memcpy(next_, b, q);
            next_ += q;
            b += q;
            n -= q;
        }
    }